

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::AdvancedLargeStrideAndOffsetsNewAndLegacyAPI::Run
          (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *this)

{
  bool bVar1;
  GLuint GVar2;
  size_type sVar3;
  reference data_00;
  Vector<float,_2> *v;
  CallLogWrapper *this_00;
  float i1_v1_a3;
  float i1_v0_a3;
  float i0_v1_a3;
  float i0_v0_a3;
  Vector<unsigned_int,_2> local_1bc;
  Vector<unsigned_int,_2> local_1b4;
  Vector<unsigned_int,_2> local_1ac;
  Vector<unsigned_int,_2> local_1a4;
  Vector<unsigned_int,_2> local_19c;
  Vector<unsigned_int,_2> local_194;
  Vector<unsigned_int,_2> local_18c;
  Vector<unsigned_int,_2> local_184;
  UVec2 i1_v1_a2;
  UVec2 i1_v0_a2;
  UVec2 i0_v1_a2;
  UVec2 i0_v0_a2;
  Vector<int,_2> local_15c;
  Vector<int,_2> local_154;
  Vector<int,_2> local_14c;
  Vector<int,_2> local_144;
  Vector<int,_2> local_13c;
  Vector<int,_2> local_134;
  Vector<int,_2> local_12c;
  Vector<int,_2> local_124;
  IVec2 i1_v1_a1;
  IVec2 i1_v0_a1;
  IVec2 i0_v1_a1;
  IVec2 i0_v0_a1;
  Vector<float,_2> local_fc;
  Vector<float,_2> local_f4;
  Vector<float,_2> local_ec;
  Vector<float,_2> local_e4;
  Vector<float,_2> local_dc;
  undefined4 local_d4;
  Vector<float,_2> local_d0;
  Vector<float,_2> local_c8;
  Vector<float,_2> local_c0;
  Vec2 i1_v1_a0;
  Vec2 i1_v0_a0;
  Vec2 i0_v1_a0;
  Vec2 i0_v0_a0;
  GLubyte *ptr_1;
  allocator<unsigned_char> local_82;
  value_type_conflict5 local_81;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vector<unsigned_int,_2> local_60;
  Vector<int,_2> local_58;
  Vector<int,_2> local_50;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  void *local_38;
  GLubyte *ptr;
  GLuint fsh;
  GLuint sh;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *this_local;
  
  glsl_vs = (char *)this;
  bVar1 = VertexAttribBindingBase::IsSSBOInVSFSAvailable(&this->super_VertexAttribBindingBase,2);
  if (bVar1) {
    glsl_fs = 
    "#version 310 es\nlayout(location = 0) in vec2 vs_in_attrib0;\nlayout(location = 4) in ivec2 vs_in_attrib1;\nlayout(location = 8) in uvec2 vs_in_attrib2;\nlayout(location = 15) in float vs_in_attrib3;\nlayout(std430, binding = 1) buffer Output {\n  vec2 attrib0[4];\n  ivec2 attrib1[4];\n  uvec2 attrib2[4];\n  float attrib3[4];\n} g_output;\nvoid main() {\n  g_output.attrib0[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib0;\n  g_output.attrib1[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib1;\n  g_output.attrib2[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib2;\n  g_output.attrib3[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib3;\n}"
    ;
    _fsh = 
    "#version 310 es\nprecision mediump float;\nout vec4 fs_out_color;\nvoid main() {\n  fs_out_color = vec4(0.5,0.5,0.5,1.0);\n}"
    ;
    if ((this->pipeline & 1U) == 0) {
      GVar2 = glu::CallLogWrapper::glCreateProgram
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      this->m_ppo = GVar2;
      ptr._4_4_ = glu::CallLogWrapper::glCreateShader
                            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,0x8b31);
      ptr._0_4_ = glu::CallLogWrapper::glCreateShader
                            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,0x8b30);
      glu::CallLogWrapper::glShaderSource
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,ptr._4_4_,1,&glsl_fs,(GLint *)0x0);
      glu::CallLogWrapper::glShaderSource
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,(GLuint)ptr,1,(GLchar **)&fsh,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,ptr._4_4_);
      glu::CallLogWrapper::glCompileShader
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,(GLuint)ptr);
      glu::CallLogWrapper::glAttachShader
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_ppo,ptr._4_4_);
      glu::CallLogWrapper::glAttachShader
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_ppo,(GLuint)ptr);
      glu::CallLogWrapper::glDeleteShader
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,ptr._4_4_);
      glu::CallLogWrapper::glDeleteShader
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,(GLuint)ptr);
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_ppo);
      bVar1 = VertexAttribBindingBase::CheckProgram
                        (&this->super_VertexAttribBindingBase,this->m_ppo);
      if (!bVar1) {
        this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
        return (long)this_local;
      }
    }
    else {
      GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8b31,1,&glsl_fs);
      this->m_vsp = GVar2;
      GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8b30,1,(GLchar **)&fsh);
      this->m_fsp = GVar2;
      bVar1 = VertexAttribBindingBase::CheckProgram
                        (&this->super_VertexAttribBindingBase,this->m_vsp);
      if ((!bVar1) ||
         (bVar1 = VertexAttribBindingBase::CheckProgram
                            (&this->super_VertexAttribBindingBase,this->m_fsp), !bVar1)) {
        this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
        return (long)this_local;
      }
      glu::CallLogWrapper::glUseProgramStages
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_ppo,1,this->m_vsp);
      glu::CallLogWrapper::glUseProgramStages
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_ppo,2,this->m_fsp);
    }
    this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,100000,(void *)0x0,0x88e4);
    local_38 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8892,0,100000,2);
    tcu::Vector<float,_2>::Vector(&local_40,1.0,2.0);
    *(float (*) [2])((long)local_38 + 0x10) = local_40.m_data;
    tcu::Vector<float,_2>::Vector(&local_48,3.0,4.0);
    *(float (*) [2])((long)local_38 + 0x810) = local_48.m_data;
    tcu::Vector<int,_2>::Vector(&local_50,5,6);
    *(int (*) [2])((long)local_38 + 0x80) = local_50.m_data;
    tcu::Vector<int,_2>::Vector(&local_58,7,8);
    *(int (*) [2])((long)local_38 + 0x880) = local_58.m_data;
    tcu::Vector<unsigned_int,_2>::Vector(&local_60,9,10);
    *(uint (*) [2])((long)local_38 + 0x400) = local_60.m_data;
    tcu::Vector<unsigned_int,_2>::Vector
              ((Vector<unsigned_int,_2> *)
               &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0xb,0xc);
    *(pointer *)((long)local_38 + 0xc00) =
         data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(undefined4 *)((long)local_38 + 0x7f0) = 0x41500000;
    *(undefined4 *)((long)local_38 + 0xff0) = 0x41600000;
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x8892);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
    glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0x10);
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,8,2,0x1405,0x400);
    glu::CallLogWrapper::glVertexAttribFormat(this_00,0xf,1,0x1406,'\0',0x7f0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
    glu::CallLogWrapper::glVertexAttribIPointer(this_00,4,2,0x1404,0x800,(void *)0x80);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glVertexAttribBinding(this_00,8,3);
    glu::CallLogWrapper::glVertexAttribBinding(this_00,0xf,3);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0x800);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,3,this->m_vbo,0,0x800);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,4);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,8);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xf);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    local_81 = 0xff;
    std::allocator<unsigned_char>::allocator(&local_82);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,0x70,&local_81,
               &local_82);
    std::allocator<unsigned_char>::~allocator(&local_82);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,1,this->m_ssbo);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,sVar3,data_00,0x88e8);
    glu::CallLogWrapper::glEnable
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c89);
    if ((this->pipeline & 1U) == 0) {
      glu::CallLogWrapper::glUseProgram
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_ppo);
    }
    else {
      glu::CallLogWrapper::glBindProgramPipeline
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_ppo);
    }
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vao);
    glu::CallLogWrapper::glDrawArraysInstanced
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,2,2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_ssbo);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    v = (Vector<float,_2> *)
        glu::CallLogWrapper::glMapBufferRange
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,sVar3,1);
    tcu::Vector<float,_2>::Vector(&i0_v1_a0,v);
    tcu::Vector<float,_2>::Vector(&i1_v0_a0,v + 1);
    tcu::Vector<float,_2>::Vector(&i1_v1_a0,v + 2);
    tcu::Vector<float,_2>::Vector(&local_c0,v + 3);
    tcu::Vector<float,_2>::Vector(&local_c8,&i0_v1_a0);
    tcu::Vector<float,_2>::Vector(&local_d0,1.0,2.0);
    bVar1 = VertexAttribBindingBase::IsEqual
                      (&this->super_VertexAttribBindingBase,&local_c8,&local_d0);
    if (bVar1) {
      tcu::Vector<float,_2>::Vector(&local_dc,&i1_v0_a0);
      tcu::Vector<float,_2>::Vector(&local_e4,3.0,4.0);
      bVar1 = VertexAttribBindingBase::IsEqual
                        (&this->super_VertexAttribBindingBase,&local_dc,&local_e4);
      if (bVar1) {
        tcu::Vector<float,_2>::Vector(&local_ec,&i1_v1_a0);
        tcu::Vector<float,_2>::Vector(&local_f4,1.0,2.0);
        bVar1 = VertexAttribBindingBase::IsEqual
                          (&this->super_VertexAttribBindingBase,&local_ec,&local_f4);
        if (bVar1) {
          tcu::Vector<float,_2>::Vector(&local_fc,&local_c0);
          tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&i0_v0_a1,3.0,4.0);
          bVar1 = VertexAttribBindingBase::IsEqual
                            (&this->super_VertexAttribBindingBase,&local_fc,(Vec2 *)&i0_v0_a1);
          if (bVar1) {
            tcu::Vector<int,_2>::Vector(&i0_v1_a1,(Vector<int,_2> *)(v + 4));
            tcu::Vector<int,_2>::Vector(&i1_v0_a1,(Vector<int,_2> *)(v + 5));
            tcu::Vector<int,_2>::Vector(&i1_v1_a1,(Vector<int,_2> *)(v + 6));
            tcu::Vector<int,_2>::Vector(&local_124,(Vector<int,_2> *)(v + 7));
            tcu::Vector<int,_2>::Vector(&local_12c,&i0_v1_a1);
            tcu::Vector<int,_2>::Vector(&local_134,5,6);
            bVar1 = VertexAttribBindingBase::IsEqual
                              (&this->super_VertexAttribBindingBase,&local_12c,&local_134);
            if (bVar1) {
              tcu::Vector<int,_2>::Vector(&local_13c,&i1_v0_a1);
              tcu::Vector<int,_2>::Vector(&local_144,7,8);
              bVar1 = VertexAttribBindingBase::IsEqual
                                (&this->super_VertexAttribBindingBase,&local_13c,&local_144);
              if (bVar1) {
                tcu::Vector<int,_2>::Vector(&local_14c,&i1_v1_a1);
                tcu::Vector<int,_2>::Vector(&local_154,5,6);
                bVar1 = VertexAttribBindingBase::IsEqual
                                  (&this->super_VertexAttribBindingBase,&local_14c,&local_154);
                if (bVar1) {
                  tcu::Vector<int,_2>::Vector(&local_15c,&local_124);
                  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&i0_v0_a2,7,8);
                  bVar1 = VertexAttribBindingBase::IsEqual
                                    (&this->super_VertexAttribBindingBase,&local_15c,
                                     (IVec2 *)&i0_v0_a2);
                  if (bVar1) {
                    tcu::Vector<unsigned_int,_2>::Vector
                              (&i0_v1_a2,(Vector<unsigned_int,_2> *)(v + 8));
                    tcu::Vector<unsigned_int,_2>::Vector
                              (&i1_v0_a2,(Vector<unsigned_int,_2> *)(v + 9));
                    tcu::Vector<unsigned_int,_2>::Vector
                              (&i1_v1_a2,(Vector<unsigned_int,_2> *)(v + 10));
                    tcu::Vector<unsigned_int,_2>::Vector
                              (&local_184,(Vector<unsigned_int,_2> *)(v + 0xb));
                    tcu::Vector<unsigned_int,_2>::Vector(&local_18c,&i0_v1_a2);
                    tcu::Vector<unsigned_int,_2>::Vector(&local_194,9,10);
                    bVar1 = VertexAttribBindingBase::IsEqual
                                      (&this->super_VertexAttribBindingBase,&local_18c,&local_194);
                    if (bVar1) {
                      tcu::Vector<unsigned_int,_2>::Vector(&local_19c,&i1_v0_a2);
                      tcu::Vector<unsigned_int,_2>::Vector(&local_1a4,0xb,0xc);
                      bVar1 = VertexAttribBindingBase::IsEqual
                                        (&this->super_VertexAttribBindingBase,&local_19c,&local_1a4)
                      ;
                      if (bVar1) {
                        tcu::Vector<unsigned_int,_2>::Vector(&local_1ac,&i1_v1_a2);
                        tcu::Vector<unsigned_int,_2>::Vector(&local_1b4,9,10);
                        bVar1 = VertexAttribBindingBase::IsEqual
                                          (&this->super_VertexAttribBindingBase,&local_1ac,
                                           &local_1b4);
                        if (bVar1) {
                          tcu::Vector<unsigned_int,_2>::Vector(&local_1bc,&local_184);
                          tcu::Vector<unsigned_int,_2>::Vector
                                    ((Vector<unsigned_int,_2> *)&i0_v1_a3,0xb,0xc);
                          bVar1 = VertexAttribBindingBase::IsEqual
                                            (&this->super_VertexAttribBindingBase,&local_1bc,
                                             (UVec2 *)&i0_v1_a3);
                          if (bVar1) {
                            if ((v[0xc].m_data[0] != 13.0) || (NAN(v[0xc].m_data[0]))) {
                              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                           &DAT_ffffffffffffffff;
                            }
                            else if ((v[0xc].m_data[1] != 14.0) || (NAN(v[0xc].m_data[1]))) {
                              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                           &DAT_ffffffffffffffff;
                            }
                            else if ((v[0xd].m_data[0] != 13.0) || (NAN(v[0xd].m_data[0]))) {
                              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                           &DAT_ffffffffffffffff;
                            }
                            else if ((v[0xd].m_data[1] != 14.0) || (NAN(v[0xd].m_data[1]))) {
                              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                           &DAT_ffffffffffffffff;
                            }
                            else {
                              glu::CallLogWrapper::glUnmapBuffer
                                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                          super_GLWrapper.super_CallLogWrapper,0x90d2);
                              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)0x0;
                            }
                          }
                          else {
                            this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                         &DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                       &DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                     &DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                   &DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                 &DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff
                  ;
                }
              }
              else {
                this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
    }
    local_d4 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  }
  else {
    this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!IsSSBOInVSFSAvailable(2))
			return NOT_SUPPORTED;
		const char* const glsl_vs =
			"#version 310 es" NL "layout(location = 0) in vec2 vs_in_attrib0;" NL
			"layout(location = 4) in ivec2 vs_in_attrib1;" NL "layout(location = 8) in uvec2 vs_in_attrib2;" NL
			"layout(location = 15) in float vs_in_attrib3;" NL "layout(std430, binding = 1) buffer Output {" NL
			"  vec2 attrib0[4];" NL "  ivec2 attrib1[4];" NL "  uvec2 attrib2[4];" NL "  float attrib3[4];" NL
			"} g_output;" NL "void main() {" NL
			"  g_output.attrib0[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib0;" NL
			"  g_output.attrib1[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib1;" NL
			"  g_output.attrib2[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib2;" NL
			"  g_output.attrib3[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib3;" NL "}";
		const char* const glsl_fs = "#version 310 es" NL "precision mediump float;" NL "out vec4 fs_out_color;" NL
									"void main() {" NL "  fs_out_color = vec4(0.5,0.5,0.5,1.0);" NL "}";
		if (pipeline)
		{
			m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_fsp = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
			if (!CheckProgram(m_vsp) || !CheckProgram(m_fsp))
				return ERROR;
			glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);
			glUseProgramStages(m_ppo, GL_FRAGMENT_SHADER_BIT, m_fsp);
		}
		else
		{
			m_ppo			 = glCreateProgram();
			const GLuint sh  = glCreateShader(GL_VERTEX_SHADER);
			const GLuint fsh = glCreateShader(GL_FRAGMENT_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glShaderSource(fsh, 1, &glsl_fs, NULL);
			glCompileShader(sh);
			glCompileShader(fsh);
			glAttachShader(m_ppo, sh);
			glAttachShader(m_ppo, fsh);
			glDeleteShader(sh);
			glDeleteShader(fsh);
			glLinkProgram(m_ppo);
			if (!CheckProgram(m_ppo))
				return ERROR;
		}

		/* vbo */
		{
			glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
			glBufferData(GL_ARRAY_BUFFER, 100000, NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBufferRange(GL_ARRAY_BUFFER, 0, 100000, GL_MAP_WRITE_BIT));
			// attrib0
			*reinterpret_cast<Vec2*>(&ptr[16 + 0 * 2048]) = Vec2(1.0f, 2.0f);
			*reinterpret_cast<Vec2*>(&ptr[16 + 1 * 2048]) = Vec2(3.0f, 4.0f);
			// attrib1
			*reinterpret_cast<IVec2*>(&ptr[128 + 0 * 2048]) = IVec2(5, 6);
			*reinterpret_cast<IVec2*>(&ptr[128 + 1 * 2048]) = IVec2(7, 8);
			// attrib2
			*reinterpret_cast<UVec2*>(&ptr[1024 + 0 * 2048]) = UVec2(9, 10);
			*reinterpret_cast<UVec2*>(&ptr[1024 + 1 * 2048]) = UVec2(11, 12);
			// attrib3
			*reinterpret_cast<float*>(&ptr[2032 + 0 * 2048]) = 13.0f;
			*reinterpret_cast<float*>(&ptr[2032 + 1 * 2048]) = 14.0f;
			glUnmapBuffer(GL_ARRAY_BUFFER);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		// vao
		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribIFormat(8, 2, GL_UNSIGNED_INT, 1024);
		glVertexAttribFormat(15, 1, GL_FLOAT, GL_FALSE, 2032);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glVertexAttribIPointer(4, 2, GL_INT, 2048, reinterpret_cast<void*>(128));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glVertexAttribBinding(8, 3);
		glVertexAttribBinding(15, 3);
		glBindVertexBuffer(0, m_vbo, 0, 2048);
		glBindVertexBuffer(3, m_vbo, 0, 2048);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(4);
		glEnableVertexAttribArray(8);
		glEnableVertexAttribArray(15);
		glBindVertexArray(0);

		// ssbo
		std::vector<GLubyte> data((sizeof(Vec2) + sizeof(IVec2) + sizeof(UVec2) + sizeof(float)) * 4, 0xff);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_ssbo);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)data.size(), &data[0], GL_DYNAMIC_DRAW);

		glEnable(GL_RASTERIZER_DISCARD);
		if (pipeline)
			glBindProgramPipeline(m_ppo);
		else
			glUseProgram(m_ppo);
		glBindVertexArray(m_vao);
		glDrawArraysInstanced(GL_POINTS, 0, 2, 2);

		/* */
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
			GLubyte* ptr = static_cast<GLubyte*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)data.size(), GL_MAP_READ_BIT));
			// attrib0
			Vec2 i0_v0_a0 = *reinterpret_cast<Vec2*>(&ptr[0]);
			Vec2 i0_v1_a0 = *reinterpret_cast<Vec2*>(&ptr[8]);
			Vec2 i1_v0_a0 = *reinterpret_cast<Vec2*>(&ptr[16]);
			Vec2 i1_v1_a0 = *reinterpret_cast<Vec2*>(&ptr[24]);
			if (!IsEqual(i0_v0_a0, Vec2(1.0f, 2.0f)))
				return ERROR;
			if (!IsEqual(i0_v1_a0, Vec2(3.0f, 4.0f)))
				return ERROR;
			if (!IsEqual(i1_v0_a0, Vec2(1.0f, 2.0f)))
				return ERROR;
			if (!IsEqual(i1_v1_a0, Vec2(3.0f, 4.0f)))
				return ERROR;
			// attrib1
			IVec2 i0_v0_a1 = *reinterpret_cast<IVec2*>(&ptr[32]);
			IVec2 i0_v1_a1 = *reinterpret_cast<IVec2*>(&ptr[40]);
			IVec2 i1_v0_a1 = *reinterpret_cast<IVec2*>(&ptr[48]);
			IVec2 i1_v1_a1 = *reinterpret_cast<IVec2*>(&ptr[56]);
			if (!IsEqual(i0_v0_a1, IVec2(5, 6)))
				return ERROR;
			if (!IsEqual(i0_v1_a1, IVec2(7, 8)))
				return ERROR;
			if (!IsEqual(i1_v0_a1, IVec2(5, 6)))
				return ERROR;
			if (!IsEqual(i1_v1_a1, IVec2(7, 8)))
				return ERROR;
			// attrib2
			UVec2 i0_v0_a2 = *reinterpret_cast<UVec2*>(&ptr[64]);
			UVec2 i0_v1_a2 = *reinterpret_cast<UVec2*>(&ptr[72]);
			UVec2 i1_v0_a2 = *reinterpret_cast<UVec2*>(&ptr[80]);
			UVec2 i1_v1_a2 = *reinterpret_cast<UVec2*>(&ptr[88]);
			if (!IsEqual(i0_v0_a2, UVec2(9, 10)))
				return ERROR;
			if (!IsEqual(i0_v1_a2, UVec2(11, 12)))
				return ERROR;
			if (!IsEqual(i1_v0_a2, UVec2(9, 10)))
				return ERROR;
			if (!IsEqual(i1_v1_a2, UVec2(11, 12)))
				return ERROR;
			// attrib3
			float i0_v0_a3 = *reinterpret_cast<float*>(&ptr[96]);
			float i0_v1_a3 = *reinterpret_cast<float*>(&ptr[100]);
			float i1_v0_a3 = *reinterpret_cast<float*>(&ptr[104]);
			float i1_v1_a3 = *reinterpret_cast<float*>(&ptr[108]);
			if (i0_v0_a3 != 13.0f)
				return ERROR;
			if (i0_v1_a3 != 14.0f)
				return ERROR;
			if (i1_v0_a3 != 13.0f)
				return ERROR;
			if (i1_v1_a3 != 14.0f)
				return ERROR;
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		return NO_ERROR;
	}